

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O0

void __thiscall imrt::Collimator::printActiveBeam(Collimator *this)

{
  bool bVar1;
  ostream *poVar2;
  void *this_00;
  size_type sVar3;
  reference pvVar4;
  long in_RDI;
  int i;
  pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> angle;
  iterator __end1;
  iterator __begin1;
  map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *__range1;
  pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *in_stack_ffffffffffffff78;
  pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *in_stack_ffffffffffffff80;
  int local_50;
  int local_40;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_38;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 0xa0;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
       ::begin((map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                *)in_stack_ffffffffffffff78);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
       ::end((map<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
              *)in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 *)0x127c32);
    std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
    pair(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    poVar2 = std::operator<<((ostream *)&std::cout,"Angle: ");
    this_00 = (void *)std::ostream::operator<<(poVar2,local_40);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_50 = 0;
    while( true ) {
      sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_38);
      if (sVar3 <= (ulong)(long)local_50) break;
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&local_38,(long)local_50);
      poVar2 = (ostream *)std::ostream::operator<<(&std::cout,pvVar4->first);
      poVar2 = std::operator<<(poVar2," , ");
      pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (&local_38,(long)local_50);
      in_stack_ffffffffffffff80 =
           (pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            *)std::ostream::operator<<(poVar2,pvVar4->second);
      std::ostream::operator<<(in_stack_ffffffffffffff80,std::endl<char,std::char_traits<char>>);
      local_50 = local_50 + 1;
    }
    std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>::
    ~pair((pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           *)0x127d5a);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  *)in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void Collimator::printActiveBeam() {
    for(auto angle:angle_row_beam_active){
      cout << "Angle: " << angle.first << endl;
      for (int i =0; i < angle.second.size(); i++) {
         cout << angle.second[i].first << " , " << angle.second[i].second<< endl;
      }
    }
  }